

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Fadds(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  uint local_68;
  uint local_64;
  int fIgnoreBoxDelays;
  int fUseXorTrick;
  int fUseFanout;
  int nPathLimit;
  int nPathMax;
  int nPathMin;
  int DelayC;
  int fVerbose;
  int fUseArt;
  int fUseNat;
  int nFaddMin;
  int c;
  Gia_Man_t *pTemp2;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fUseArt = 3;
  bVar1 = false;
  bVar2 = false;
  nPathMin = 0;
  nPathMax = 0;
  nPathLimit = 3;
  fUseFanout = 0x20;
  fUseXorTrick = 0x32;
  fIgnoreBoxDelays = 0;
  local_64 = 0;
  local_68 = 0;
  Extra_UtilGetoptReset();
LAB_002c0d8a:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"NBSLPnafxbvh");
    if (iVar3 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Fadds(): There is no AIG.\n");
        return 0;
      }
      if (bVar1) {
        pTemp2 = Gia_ManDupWithNaturalBoxes(pAbc->pGia,fUseArt,nPathMin);
      }
      else {
        pTemp2 = Gia_ManDup(pAbc->pGia);
        Gia_ManTransferTiming(pTemp2,pAbc->pGia);
      }
      if (bVar2) {
        _nFaddMin = Gia_ManDupWithArtificialBoxes
                              (pTemp2,nPathMax,nPathLimit,fUseFanout,fUseXorTrick,fIgnoreBoxDelays,
                               local_64,local_68,nPathMin);
      }
      else {
        _nFaddMin = Gia_ManDup(pTemp2);
        Gia_ManTransferTiming(_nFaddMin,pTemp2);
      }
      Gia_ManStop(pTemp2);
      Abc_FrameUpdateGia(pAbc,_nFaddMin);
      return 0;
    }
    switch(iVar3) {
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_002c110a;
      }
      nPathMax = atoi(argv[globalUtilOptind]);
      iVar3 = nPathMax;
      break;
    default:
      goto LAB_002c110a;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_002c110a;
      }
      fUseFanout = atoi(argv[globalUtilOptind]);
      iVar3 = fUseFanout;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_002c110a;
      }
      fUseArt = atoi(argv[globalUtilOptind]);
      iVar3 = fUseArt;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002c110a;
      }
      fUseXorTrick = atoi(argv[globalUtilOptind]);
      iVar3 = fUseXorTrick;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002c110a;
      }
      nPathLimit = atoi(argv[globalUtilOptind]);
      iVar3 = nPathLimit;
      break;
    case 0x61:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_002c0d8a;
    case 0x62:
      local_68 = local_68 ^ 1;
      goto LAB_002c0d8a;
    case 0x66:
      fIgnoreBoxDelays = fIgnoreBoxDelays ^ 1;
      goto LAB_002c0d8a;
    case 0x68:
      goto LAB_002c110a;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002c0d8a;
    case 0x76:
      nPathMin = nPathMin ^ 1;
      goto LAB_002c0d8a;
    case 0x78:
      local_64 = local_64 ^ 1;
      goto LAB_002c0d8a;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar3 < 0) {
LAB_002c110a:
      Abc_Print(-2,"usage: &fadds [-NBSLP num] [-nafxvh]\n");
      Abc_Print(-2,"\t         detects full-adder chains and puts them into white boxes\n");
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggles detecting natural full-adder chains [default = %s]\n",pcVar4)
      ;
      Abc_Print(-2,
                "\t-N num : minimum length of a natural full-adder chain to detect [default = %d]\n"
                ,(ulong)(uint)fUseArt);
      pcVar4 = "no";
      if (bVar2) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggles detecting artificial full-adder chains [default = %s]\n",
                pcVar4);
      Abc_Print(-2,"\t-B num : full-adder box delay (percentage of AND-gate delay) [default = %d]\n"
                ,(ulong)(uint)nPathMax);
      Abc_Print(-2,"\t-S num : minimum length of an artificial full-adder chain [default = %d]\n",
                (ulong)(uint)nPathLimit);
      Abc_Print(-2,"\t-L num : maximum length of an artificial full-adder chain [default = %d]\n",
                (ulong)(uint)fUseFanout);
      Abc_Print(-2,
                "\t-P num : maximum number of artificial full-adder chains to detect [default = %d]\n"
                ,(ulong)(uint)fUseXorTrick);
      pcVar4 = "no";
      if (fIgnoreBoxDelays != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-f     : toggles allowing external fanouts in artificial chains [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (local_64 != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-x     : toggles using XOR to generate fanouts in artificial chains [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (local_68 != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggles ignoring boxes when computing delays [default = %s]\n",pcVar4
               );
      pcVar4 = "no";
      if (nPathMin != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Fadds( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDupWithNaturalBoxes( Gia_Man_t * p, int nFaddMin, int fVerbose );
    extern Gia_Man_t * Gia_ManDupWithArtificialBoxes( Gia_Man_t * p, int DelayC, int nPathMin, int nPathMax, int nPathLimit, int fUseFanout, int fXorTrick, int fIgnoreBoxDelays, int fVerbose );
    Gia_Man_t * pTemp, * pTemp2;
    int c, nFaddMin = 3, fUseNat = 0, fUseArt = 0, fVerbose = 0;
    int DelayC = 0, nPathMin = 3, nPathMax = 32, nPathLimit = 50, fUseFanout = 0, fUseXorTrick = 0, fIgnoreBoxDelays = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NBSLPnafxbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nFaddMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFaddMin < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            DelayC = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( DelayC < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nPathMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPathMin < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nPathMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPathMax < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPathLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPathLimit < 0 )
                goto usage;
            break;
        case 'n':
            fUseNat ^= 1;
            break;
        case 'a':
            fUseArt ^= 1;
            break;
        case 'f':
            fUseFanout ^= 1;
            break;
        case 'x':
            fUseXorTrick ^= 1;
            break;
        case 'b':
            fIgnoreBoxDelays ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Fadds(): There is no AIG.\n" );
        return 0;
    }
    if ( fUseNat )
        pTemp = Gia_ManDupWithNaturalBoxes( pAbc->pGia, nFaddMin, fVerbose );
    else
    {
        pTemp = Gia_ManDup( pAbc->pGia );
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
    }
    if ( fUseArt )
        pTemp2 = Gia_ManDupWithArtificialBoxes( pTemp, DelayC, nPathMin, nPathMax, nPathLimit, fUseFanout, fUseXorTrick, fIgnoreBoxDelays, fVerbose );
    else
    {
        pTemp2 = Gia_ManDup( pTemp );
        Gia_ManTransferTiming( pTemp2, pTemp );
    }
    Gia_ManStop( pTemp );
    Abc_FrameUpdateGia( pAbc, pTemp2 );
    return 0;
usage:
    Abc_Print( -2, "usage: &fadds [-NBSLP num] [-nafxvh]\n" );
    Abc_Print( -2, "\t         detects full-adder chains and puts them into white boxes\n" );
    Abc_Print( -2, "\t-n     : toggles detecting natural full-adder chains [default = %s]\n",              fUseNat? "yes": "no" );
    Abc_Print( -2, "\t-N num : minimum length of a natural full-adder chain to detect [default = %d]\n",   nFaddMin );
    Abc_Print( -2, "\t-a     : toggles detecting artificial full-adder chains [default = %s]\n",           fUseArt? "yes": "no" );
    Abc_Print( -2, "\t-B num : full-adder box delay (percentage of AND-gate delay) [default = %d]\n",      DelayC );
    Abc_Print( -2, "\t-S num : minimum length of an artificial full-adder chain [default = %d]\n",         nPathMin );
    Abc_Print( -2, "\t-L num : maximum length of an artificial full-adder chain [default = %d]\n",         nPathMax );
    Abc_Print( -2, "\t-P num : maximum number of artificial full-adder chains to detect [default = %d]\n", nPathLimit );
    Abc_Print( -2, "\t-f     : toggles allowing external fanouts in artificial chains [default = %s]\n",   fUseFanout? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggles using XOR to generate fanouts in artificial chains [default = %s]\n",   fUseXorTrick? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggles ignoring boxes when computing delays [default = %s]\n",             fIgnoreBoxDelays? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",                     fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}